

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.hpp
# Opt level: O1

json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
nlohmann::json_abi_v3_11_2::
json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator/=(json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,size_t array_idx)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  char cVar4;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar4 = '\x01';
  if (9 < array_idx) {
    sVar3 = array_idx;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (sVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001491fd;
      }
      if (sVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001491fd;
      }
      if (sVar3 < 10000) goto LAB_001491fd;
      bVar1 = 99999 < sVar3;
      sVar3 = sVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001491fd:
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_40._M_dataplus._M_p,(uint)local_40._M_string_length,array_idx);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

json_pointer& operator/=(std::size_t array_idx)
    {
        return *this /= std::to_string(array_idx);
    }